

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

ClientHook * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::ensureAccepted
          (DeferredThirdPartyClient *this)

{
  Reader contact;
  Tag TVar1;
  RpcConnectionState *vine;
  RefOrVoid<capnp::AnyPointer::Reader> pRVar2;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *other;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar3;
  RefOrVoid<capnp::ClientHook> pCVar4;
  Own<capnp::ClientHook,_std::nullptr_t> *_kj_switch_done_1;
  Own<capnp::ClientHook,_std::nullptr_t> *cap;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> local_78;
  SegmentReader *local_68;
  CapTableReader *pCStack_60;
  WirePointer *local_58;
  undefined8 uStack_50;
  undefined1 local_40 [24];
  Deferred *_kj_switch_done;
  Deferred *deferred;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
  *_kj_switch_subject;
  DeferredThirdPartyClient *this_local;
  
  _kj_switch_subject =
       (OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
        *)this;
  deferred = (Deferred *)
             kj::
             OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
             ::_switchSubject(&this->state);
  TVar1 = kj::
          OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
          ::which((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
                   *)deferred);
  if (TVar1 == _variant0) {
    local_40._16_8_ =
         kj::
         OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
         ::get<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred>
                   ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
                     *)deferred);
    if ((Deferred *)local_40._16_8_ != (Deferred *)0x0) {
      _kj_switch_done = (Deferred *)local_40._16_8_;
      vine = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&(this->super_RpcClient).connectionState);
      pRVar2 = kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::operator*
                         (&_kj_switch_done->contact);
      local_68 = (pRVar2->reader).segment;
      pCStack_60 = (pRVar2->reader).capTable;
      local_58 = (pRVar2->reader).pointer;
      uStack_50 = *(undefined8 *)&(pRVar2->reader).nestingLimit;
      other = kj::
              mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                        (&_kj_switch_done->vine);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::Own
                (&local_78,other);
      contact.reader.capTable = pCStack_60;
      contact.reader.segment = local_68;
      contact.reader.pointer = local_58;
      contact.reader._24_8_ = uStack_50;
      acceptThirdParty((RpcConnectionState *)local_40,contact,
                       (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                        *)vine,SUB81(&local_78,0));
      pOVar3 = kj::
               OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
               ::
               init<kj::Own<capnp::ClientHook,decltype(nullptr)>,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                         ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                           *)&this->state,(Own<capnp::ClientHook,_std::nullptr_t> *)local_40);
      this_local = (DeferredThirdPartyClient *)
                   kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*(pOVar3);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)local_40);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::~Own
                (&local_78);
      return (ClientHook *)this_local;
    }
    local_40._16_4_ = 0;
    local_40._20_4_ = 0;
    _kj_switch_done = (Deferred *)0x0;
  }
  else if ((TVar1 == _variant1) &&
          (pOVar3 = kj::
                    OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                    ::get<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                              ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                                *)deferred), pOVar3 != (Own<capnp::ClientHook,_std::nullptr_t> *)0x0
          )) {
    pCVar4 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*(pOVar3);
    return pCVar4;
  }
  kj::_::unreachable();
}

Assistant:

ClientHook& ensureAccepted() {
      // Call when this capability is actually used locally. If it's the first use, the Accept
      // message will be sent to actually accept it.

      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          return *state.init<kj::Own<ClientHook>>(
              connectionState->acceptThirdParty(
                  *deferred.contact, kj::mv(deferred.vine), needEmbargo));
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return *cap;
        }
      }
      KJ_UNREACHABLE;
    }